

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O1

void __thiscall acto::core::msg_wrap_t<A::M1>::~msg_wrap_t(msg_wrap_t<A::M1> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  pcVar2 = (this->super_message_container_t<A::M1>).value_.s._M_dataplus._M_p;
  paVar1 = &(this->super_message_container_t<A::M1>).value_.s.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  msg_t::~msg_t(&this->super_msg_t);
  operator_delete(this,0x40);
  return;
}

Assistant:

constexpr msg_wrap_t(T&& d) noexcept(
    std::is_nothrow_constructible_v<message_container_t<T>, T&&>)
    : msg_t(typeid(T))
    , message_container_t<T>(std::move(d)) {
  }